

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

int json_object_set_new_nocheck(json_t *json,char *key,json_t *value)

{
  int iVar1;
  json_object_t *object;
  json_t *value_local;
  char *key_local;
  json_t *json_local;
  
  if (value == (json_t *)0x0) {
    json_local._4_4_ = -1;
  }
  else if ((((key == (char *)0x0) || (json == (json_t *)0x0)) || (json->type != JSON_OBJECT)) ||
          (json == value)) {
    json_decref(value);
    json_local._4_4_ = -1;
  }
  else {
    iVar1 = hashtable_set((hashtable_t *)(json + 1),key,value);
    if (iVar1 == 0) {
      json_local._4_4_ = 0;
    }
    else {
      json_decref(value);
      json_local._4_4_ = -1;
    }
  }
  return json_local._4_4_;
}

Assistant:

int json_object_set_new_nocheck(json_t *json, const char *key, json_t *value)
{
	json_object_t *object;

	if (!value)
		return -1;

	if (!key || !json_is_object(json) || json == value)
	{
		json_decref(value);
		return -1;
	}
	object = json_to_object(json);

	if (hashtable_set(&object->hashtable, key, value))
	{
		json_decref(value);
		return -1;
	}

	return 0;
}